

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O3

void __thiscall rsg::SubValueRangeIterator::next(SubValueRangeIterator *this)

{
  pointer *ppCVar1;
  pointer pCVar2;
  VariableType *this_00;
  Scalar *pSVar3;
  iterator iVar4;
  int iVar5;
  int iVar6;
  int memberNdx;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  ConstValueRangeAccess local_50;
  Scalar *local_38;
  
  pCVar2 = (this->m_stack).
           super__Vector_base<rsg::ConstValueRangeAccess,_std::allocator<rsg::ConstValueRangeAccess>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = pCVar2[-1].m_type;
  local_38 = pCVar2[-1].m_min;
  pSVar3 = pCVar2[-1].m_max;
  (this->m_stack).
  super__Vector_base<rsg::ConstValueRangeAccess,_std::allocator<rsg::ConstValueRangeAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = pCVar2 + -1;
  if (this_00->m_baseType == TYPE_STRUCT) {
    uVar7 = (int)((long)(this_00->m_members).
                        super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this_00->m_members).
                        super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x33333333;
    if (0 < (int)uVar7) {
      lVar9 = 0;
      uVar8 = 0;
      do {
        iVar6 = VariableType::getMemberScalarOffset(this_00,(int)uVar8);
        local_50.m_type =
             *(VariableType **)
              ((long)&((this_00->m_members).
                       super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_type + lVar9);
        local_50.m_min = local_38 + iVar6;
        local_50.m_max = pSVar3 + iVar6;
        iVar4._M_current =
             (this->m_stack).
             super__Vector_base<rsg::ConstValueRangeAccess,_std::allocator<rsg::ConstValueRangeAccess>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->m_stack).
            super__Vector_base<rsg::ConstValueRangeAccess,_std::allocator<rsg::ConstValueRangeAccess>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<rsg::ConstValueRangeAccess,_std::allocator<rsg::ConstValueRangeAccess>_>::
          _M_realloc_insert<rsg::ConstValueRangeAccess>(&this->m_stack,iVar4,&local_50);
        }
        else {
          (iVar4._M_current)->m_max = local_50.m_max;
          (iVar4._M_current)->m_type = local_50.m_type;
          (iVar4._M_current)->m_min = local_50.m_min;
          ppCVar1 = &(this->m_stack).
                     super__Vector_base<rsg::ConstValueRangeAccess,_std::allocator<rsg::ConstValueRangeAccess>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppCVar1 = *ppCVar1 + 1;
        }
        uVar8 = uVar8 + 1;
        lVar9 = lVar9 + 0x28;
      } while ((uVar7 & 0x7fffffff) != uVar8);
    }
  }
  else if ((this_00->m_baseType == TYPE_ARRAY) && (iVar6 = this_00->m_numElements, 0 < (long)iVar6))
  {
    lVar9 = 0;
    memberNdx = 0;
    do {
      iVar5 = VariableType::getMemberScalarOffset(this_00,memberNdx);
      local_50.m_type =
           *(VariableType **)
            ((long)&((this_00->m_members).
                     super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_type + lVar9);
      local_50.m_min = local_38 + iVar5;
      local_50.m_max = pSVar3 + iVar5;
      iVar4._M_current =
           (this->m_stack).
           super__Vector_base<rsg::ConstValueRangeAccess,_std::allocator<rsg::ConstValueRangeAccess>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->m_stack).
          super__Vector_base<rsg::ConstValueRangeAccess,_std::allocator<rsg::ConstValueRangeAccess>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<rsg::ConstValueRangeAccess,_std::allocator<rsg::ConstValueRangeAccess>_>::
        _M_realloc_insert<rsg::ConstValueRangeAccess>(&this->m_stack,iVar4,&local_50);
      }
      else {
        (iVar4._M_current)->m_max = local_50.m_max;
        (iVar4._M_current)->m_type = local_50.m_type;
        (iVar4._M_current)->m_min = local_50.m_min;
        ppCVar1 = &(this->m_stack).
                   super__Vector_base<rsg::ConstValueRangeAccess,_std::allocator<rsg::ConstValueRangeAccess>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppCVar1 = *ppCVar1 + 1;
      }
      memberNdx = memberNdx + 1;
      lVar9 = lVar9 + 0x28;
    } while ((long)iVar6 * 0x28 != lVar9);
  }
  return;
}

Assistant:

void SubValueRangeIterator::next (void)
{
	ConstValueRangeAccess curItem = getItem();
	m_stack.pop_back(); // Remove current

	switch (curItem.getType().getBaseType())
	{
		case VariableType::TYPE_ARRAY:
		{
			int numElements = curItem.getType().getNumElements();
			for (int ndx = 0; ndx < numElements; ndx++)
				m_stack.push_back(curItem.member(ndx));
			break;
		}

		case VariableType::TYPE_STRUCT:
		{
			int numMembers = (int)curItem.getType().getMembers().size();
			for (int ndx = 0; ndx < numMembers; ndx++)
				m_stack.push_back(curItem.member(ndx));
			break;
		}

		default:
			break; // \todo [2011-02-03 pyry] Swizzle control?
	}
}